

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
         BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
         *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  FastAllocator *pFVar5;
  __uniq_ptr_data<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>,_true,_true>
  this_00;
  iterator __position;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  ThreadLocal *pTVar7;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *pBVar8;
  char cVar9;
  uint uVar10;
  long *plVar11;
  ThreadLocal2 *this_01;
  undefined1 (*pauVar12) [16];
  int *piVar13;
  size_t sVar14;
  runtime_error *this_02;
  int iVar15;
  int iVar16;
  ulong uVar17;
  MutexSys *pMVar18;
  uint uVar19;
  ulong uVar20;
  size_t *psVar21;
  uint uVar22;
  uint uVar23;
  size_type sVar24;
  range<unsigned_int> *prVar25;
  char *pcVar26;
  MutexSys *pMVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  task_group_context context;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  auto_partitioner local_2f9;
  size_t local_2f8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_2f0;
  undefined1 local_2e8 [16];
  blocked_range<unsigned_long> local_2d0;
  range<unsigned_int> local_2b8;
  range<unsigned_int> local_2b0 [7];
  undefined1 local_278 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_258 [2];
  string_resource_index local_238;
  undefined1 local_1f8 [16];
  anon_class_32_4_e5015336 local_1e0;
  anon_class_8_1_898bcfc2 local_1c0;
  ThreadLocal2 local_1b8 [2];
  
  local_2f8 = depth;
  if (alloc.alloc == (FastAllocator *)0x0) {
    local_2e8._0_8_ = this;
    pFVar5 = (this->createAllocator->super_Create).allocator;
    plVar11 = (long *)__tls_get_addr(&PTR_02224d38);
    this_01 = (ThreadLocal2 *)*plVar11;
    if (this_01 == (ThreadLocal2 *)0x0) {
      this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys((MutexSys *)this_01);
      (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_01->alloc0).parent = this_01;
      auVar29 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_01->alloc0).ptr = (char *)auVar29._0_8_;
      (this_01->alloc0).cur = auVar29._8_8_;
      (this_01->alloc0).end = auVar29._16_8_;
      (this_01->alloc0).allocBlockSize = auVar29._24_8_;
      (this_01->alloc0).end = auVar29._0_8_;
      (this_01->alloc0).allocBlockSize = auVar29._8_8_;
      (this_01->alloc0).bytesUsed = auVar29._16_8_;
      (this_01->alloc0).bytesWasted = auVar29._24_8_;
      (this_01->alloc1).parent = this_01;
      auVar29 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_01->alloc1).ptr = (char *)auVar29._0_8_;
      (this_01->alloc1).cur = auVar29._8_8_;
      (this_01->alloc1).end = auVar29._16_8_;
      (this_01->alloc1).allocBlockSize = auVar29._24_8_;
      (this_01->alloc1).end = auVar29._0_8_;
      (this_01->alloc1).allocBlockSize = auVar29._8_8_;
      (this_01->alloc1).bytesUsed = auVar29._16_8_;
      (this_01->alloc1).bytesWasted = auVar29._24_8_;
      *plVar11 = (long)this_01;
      local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
      local_1b8[0].alloc._M_b._M_p._0_1_ = '\x01';
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_278._0_8_ = this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_278);
      if ((ThreadLocal2 *)local_278._0_8_ != (ThreadLocal2 *)0x0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)local_278,
                   (ThreadLocal2 *)local_278._0_8_);
      }
      if ((char)local_1b8[0].alloc._M_b._M_p == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b8[0].mutex.mutex);
      }
    }
    alloc.talloc0 = &this_01->alloc0;
    alloc.talloc1 = &this_01->alloc1;
    if (pFVar5->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
    this = (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
            *)local_2e8._0_8_;
    alloc.alloc = pFVar5;
  }
  if ((toplevel) &&
     ((ulong)(current->_end - current->_begin) <= (this->super_Settings).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  if ((this->super_Settings).maxDepth <= local_2f8 + 8) {
LAB_0154ff94:
    alloc_01.talloc0 = alloc.talloc0;
    alloc_01.alloc = alloc.alloc;
    alloc_01.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,local_2f8,current,alloc_01);
    return __return_storage_ptr__;
  }
  if ((ulong)(current->_end - current->_begin) <= (this->super_Settings).minLeafSize)
  goto LAB_0154ff94;
  uVar19 = this->morton[current->_begin].field_0.field_0.code;
  uVar10 = this->morton[current->_end - 1].field_0.field_0.code;
  if (uVar19 == uVar10) {
    iVar15 = 0x20;
  }
  else {
    uVar10 = uVar10 ^ uVar19;
    iVar15 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    iVar15 = 0x1f - iVar15;
  }
  local_2f0 = __return_storage_ptr__;
  if (iVar15 == 0x20) {
    recreateMortonCodes(this,current);
    uVar10 = current->_begin;
    uVar19 = current->_end;
    uVar22 = this->morton[uVar10].field_0.field_0.code;
    uVar23 = this->morton[uVar19 - 1].field_0.field_0.code;
    if (uVar22 == uVar23) {
      iVar15 = 0x20;
    }
    else {
      uVar23 = uVar23 ^ uVar22;
      iVar15 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> iVar15 == 0; iVar15 = iVar15 + -1) {
        }
      }
      iVar15 = 0x1f - iVar15;
    }
    if (iVar15 != 0x20) goto LAB_0154f91f;
    uVar22 = uVar19 + uVar10 >> 1;
    uVar17 = (ulong)uVar22;
    local_2b8._end = uVar22;
    local_2b8._begin = uVar10;
  }
  else {
LAB_0154f91f:
    uVar10 = current->_begin;
    uVar20 = (ulong)uVar10;
    uVar19 = current->_end;
    uVar17 = (ulong)uVar19;
    if (uVar10 + 1 != uVar19) {
      uVar22 = uVar19;
      do {
        uVar23 = uVar22 + uVar10 >> 1;
        uVar17 = (ulong)uVar23;
        if ((this->morton[uVar17].field_0.field_0.code & 0x80000000U >> ((byte)iVar15 & 0x1f)) == 0)
        {
          uVar17 = (ulong)uVar22;
          uVar10 = uVar23;
        }
        uVar22 = (uint)uVar17;
      } while (uVar10 + 1 != uVar22);
    }
    local_2b8 = (range<unsigned_int>)(uVar17 << 0x20 | uVar20);
  }
  local_2b0[0] = (range<unsigned_int>)((ulong)uVar19 << 0x20 | uVar17);
  pMVar27 = (MutexSys *)0x2;
  do {
    if ((MutexSys *)(this->super_Settings).branchingFactor <= pMVar27) break;
    if (pMVar27 == (MutexSys *)0x0) {
      iVar15 = -1;
    }
    else {
      uVar17 = 0;
      uVar20 = 0xffffffff;
      uVar19 = 0;
      do {
        uVar10 = (&local_2b8)[uVar17]._end - local_2b0[uVar17 - 1]._begin;
        if ((this->super_Settings).minLeafSize < (ulong)uVar10 && uVar19 < uVar10) {
          uVar20 = uVar17 & 0xffffffff;
          uVar19 = uVar10;
        }
        iVar15 = (int)uVar20;
        uVar17 = uVar17 + 1;
      } while ((MutexSys *)(uVar17 & 0xffffffff) < pMVar27);
    }
    if (iVar15 != -1) {
      uVar19 = this->morton[local_2b0[(long)iVar15 + -1]._begin].field_0.field_0.code;
      uVar10 = this->morton[(&local_2b8)[iVar15]._end - 1].field_0.field_0.code;
      if (uVar19 == uVar10) {
        iVar16 = 0x20;
      }
      else {
        uVar10 = uVar10 ^ uVar19;
        iVar16 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        iVar16 = 0x1f - iVar16;
      }
      prVar25 = local_2b0 + (long)iVar15 + -1;
      if (iVar16 == 0x20) {
        recreateMortonCodes(this,prVar25);
        uVar10 = prVar25->_begin;
        uVar19 = (&local_2b8)[iVar15]._end;
        uVar22 = this->morton[uVar10].field_0.field_0.code;
        uVar23 = this->morton[uVar19 - 1].field_0.field_0.code;
        if (uVar22 == uVar23) {
          iVar16 = 0x20;
        }
        else {
          uVar23 = uVar23 ^ uVar22;
          iVar16 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> iVar16 == 0; iVar16 = iVar16 + -1) {
            }
          }
          iVar16 = 0x1f - iVar16;
        }
        if (iVar16 != 0x20) goto LAB_0154fa0f;
        uVar22 = uVar19 + uVar10 >> 1;
        uVar17 = (ulong)uVar22;
        sVar24 = CONCAT44(uVar22,uVar10);
      }
      else {
LAB_0154fa0f:
        uVar10 = prVar25->_begin;
        uVar20 = (ulong)uVar10;
        uVar19 = (&local_2b8)[iVar15]._end;
        uVar17 = (ulong)uVar19;
        if (uVar10 + 1 != uVar19) {
          uVar22 = uVar19;
          do {
            uVar23 = uVar22 + uVar10 >> 1;
            uVar17 = (ulong)uVar23;
            if ((this->morton[uVar17].field_0.field_0.code & 0x80000000U >> ((byte)iVar16 & 0x1f))
                == 0) {
              uVar17 = (ulong)uVar22;
              uVar10 = uVar23;
            }
            uVar22 = (uint)uVar17;
          } while (uVar10 + 1 != uVar22);
        }
        sVar24 = uVar17 << 0x20 | uVar20;
      }
      *prVar25 = *(range<unsigned_int> *)(&local_2d0.my_grainsize + (long)pMVar27);
      (&local_2d0.my_grainsize)[(long)pMVar27] = sVar24;
      local_2b0[(long)((long)&pMVar27[-1].mutex + 7)] =
           (range<unsigned_int>)((ulong)uVar19 << 0x20 | uVar17);
      pMVar27 = (MutexSys *)((long)&pMVar27->mutex + 1);
    }
  } while (iVar15 != -1);
  pBVar8 = local_2f0;
  pTVar7 = alloc.talloc0;
  pFVar5 = alloc.alloc;
  if (pMVar27 == (MutexSys *)0x1) {
    CreateMortonLeaf<4,_embree::TriangleMv<4>_>::operator()
              (local_2f0,this->createLeaf,current,&alloc);
    return pBVar8;
  }
  local_2d0.my_end = 0x80;
  this_00.
  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
       (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
        )(alloc.talloc0)->parent;
  if (alloc.alloc !=
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_00.
              super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p) {
    local_278[8] = '\x01';
    local_278._0_8_ =
         this_00.
         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         ._M_t.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)
                   this_00.
                   super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl
                  );
    if ((((atomic<embree::FastAllocator_*> *)
         ((long)this_00.
                super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                ._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         8))->_M_b)._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xa8) +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x68);
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)this_00.
                                    super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                    .
                                    super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                    ._M_head_impl + 0x58) +
            (long)*(void **)((long)this_00.
                                   super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x98)) -
           ((long)*(void **)((long)this_00.
                                   super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x50) +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x90)));
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xb0) +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x70);
      UNLOCK();
    }
    auVar28 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])
     ((long)this_00.
            super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 0x58
     ) = ZEXT1632(auVar28);
    *(undefined1 (*) [32])
     ((long)this_00.
            super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 0x48
     ) = ZEXT1632(auVar28);
    auVar29 = ZEXT1632(auVar28);
    if (pFVar5 == (FastAllocator *)0x0) {
      *(undefined1 (*) [32])
       ((long)this_00.
              super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x98) = auVar29;
      *(undefined1 (*) [32])
       ((long)this_00.
              super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x88) = auVar29;
    }
    else {
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x60) = (void *)pFVar5->defaultBlockSize;
      *(undefined1 (*) [32])
       ((long)this_00.
              super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x88) = auVar29;
      *(undefined1 (*) [32])
       ((long)this_00.
              super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x98) = auVar29;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)pFVar5->defaultBlockSize;
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)
     ((long)this_00.
            super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8))
    ->_M_b)._M_p = pFVar5;
    UNLOCK();
    local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_1b8[0].alloc._M_b._M_p._0_1_ = '\x01';
    local_1e0.bounds =
         (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])
         this_00.
         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         ._M_t.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar5->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar5->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar5->thread_local_allocators,__position,(ThreadLocal2 **)&local_1e0);
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_1e0.bounds;
      pppTVar2 = &(pFVar5->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)local_1b8[0].alloc._M_b._M_p == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b8[0].mutex.mutex);
    }
    if (local_278[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_278._0_8_);
    }
  }
  pTVar7->bytesUsed = (long)(void **)local_2d0.my_end + pTVar7->bytesUsed;
  sVar14 = pTVar7->cur;
  uVar17 = (ulong)(-(int)sVar14 & 0xf);
  uVar20 = (long)(void **)local_2d0.my_end + uVar17 + sVar14;
  pTVar7->cur = uVar20;
  if (pTVar7->end < uVar20) {
    pTVar7->cur = sVar14;
    if ((MutexSys *)pTVar7->allocBlockSize < (MutexSys *)(local_2d0.my_end << 2)) {
      pcVar26 = (char *)FastAllocator::malloc(pFVar5,(size_t)&local_2d0);
    }
    else {
      local_1b8[0].mutex.mutex = (MutexSys *)pTVar7->allocBlockSize;
      pcVar26 = (char *)FastAllocator::malloc(pFVar5,(size_t)local_1b8);
      pTVar7->ptr = pcVar26;
      sVar14 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar14;
      pTVar7->cur = 0;
      pTVar7->end = (size_t)local_1b8[0].mutex.mutex;
      pTVar7->cur = local_2d0.my_end;
      if (local_1b8[0].mutex.mutex < local_2d0.my_end) {
        pTVar7->cur = 0;
        local_1b8[0].mutex.mutex = (void *)pTVar7->allocBlockSize;
        pcVar26 = (char *)FastAllocator::malloc(pFVar5,(size_t)local_1b8);
        pTVar7->ptr = pcVar26;
        sVar14 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar14;
        pTVar7->cur = 0;
        pTVar7->end = (size_t)local_1b8[0].mutex.mutex;
        pTVar7->cur = local_2d0.my_end;
        if (local_1b8[0].mutex.mutex < local_2d0.my_end) {
          pTVar7->cur = 0;
          pcVar26 = (char *)0x0;
          goto LAB_0154fca5;
        }
      }
      pTVar7->bytesWasted = sVar14;
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar17;
    pcVar26 = pTVar7->ptr + (uVar20 - local_2d0.my_end);
  }
LAB_0154fca5:
  pcVar26[0x60] = '\0';
  pcVar26[0x61] = '\0';
  pcVar26[0x62] = -0x80;
  pcVar26[99] = '\x7f';
  pcVar26[100] = '\0';
  pcVar26[0x65] = '\0';
  pcVar26[0x66] = -0x80;
  pcVar26[0x67] = '\x7f';
  pcVar26[0x68] = '\0';
  pcVar26[0x69] = '\0';
  pcVar26[0x6a] = -0x80;
  pcVar26[0x6b] = '\x7f';
  pcVar26[0x6c] = '\0';
  pcVar26[0x6d] = '\0';
  pcVar26[0x6e] = -0x80;
  pcVar26[0x6f] = '\x7f';
  pcVar26[0x40] = '\0';
  pcVar26[0x41] = '\0';
  pcVar26[0x42] = -0x80;
  pcVar26[0x43] = '\x7f';
  pcVar26[0x44] = '\0';
  pcVar26[0x45] = '\0';
  pcVar26[0x46] = -0x80;
  pcVar26[0x47] = '\x7f';
  pcVar26[0x48] = '\0';
  pcVar26[0x49] = '\0';
  pcVar26[0x4a] = -0x80;
  pcVar26[0x4b] = '\x7f';
  pcVar26[0x4c] = '\0';
  pcVar26[0x4d] = '\0';
  pcVar26[0x4e] = -0x80;
  pcVar26[0x4f] = '\x7f';
  pcVar26[0x20] = '\0';
  pcVar26[0x21] = '\0';
  pcVar26[0x22] = -0x80;
  pcVar26[0x23] = '\x7f';
  pcVar26[0x24] = '\0';
  pcVar26[0x25] = '\0';
  pcVar26[0x26] = -0x80;
  pcVar26[0x27] = '\x7f';
  pcVar26[0x28] = '\0';
  pcVar26[0x29] = '\0';
  pcVar26[0x2a] = -0x80;
  pcVar26[0x2b] = '\x7f';
  pcVar26[0x2c] = '\0';
  pcVar26[0x2d] = '\0';
  pcVar26[0x2e] = -0x80;
  pcVar26[0x2f] = '\x7f';
  pcVar26[0x70] = '\0';
  pcVar26[0x71] = '\0';
  pcVar26[0x72] = -0x80;
  pcVar26[0x73] = -1;
  pcVar26[0x74] = '\0';
  pcVar26[0x75] = '\0';
  pcVar26[0x76] = -0x80;
  pcVar26[0x77] = -1;
  pcVar26[0x78] = '\0';
  pcVar26[0x79] = '\0';
  pcVar26[0x7a] = -0x80;
  pcVar26[0x7b] = -1;
  pcVar26[0x7c] = '\0';
  pcVar26[0x7d] = '\0';
  pcVar26[0x7e] = -0x80;
  pcVar26[0x7f] = -1;
  pcVar26[0x50] = '\0';
  pcVar26[0x51] = '\0';
  pcVar26[0x52] = -0x80;
  pcVar26[0x53] = -1;
  pcVar26[0x54] = '\0';
  pcVar26[0x55] = '\0';
  pcVar26[0x56] = -0x80;
  pcVar26[0x57] = -1;
  pcVar26[0x58] = '\0';
  pcVar26[0x59] = '\0';
  pcVar26[0x5a] = -0x80;
  pcVar26[0x5b] = -1;
  pcVar26[0x5c] = '\0';
  pcVar26[0x5d] = '\0';
  pcVar26[0x5e] = -0x80;
  pcVar26[0x5f] = -1;
  pcVar26[0x30] = '\0';
  pcVar26[0x31] = '\0';
  pcVar26[0x32] = -0x80;
  pcVar26[0x33] = -1;
  pcVar26[0x34] = '\0';
  pcVar26[0x35] = '\0';
  pcVar26[0x36] = -0x80;
  pcVar26[0x37] = -1;
  pcVar26[0x38] = '\0';
  pcVar26[0x39] = '\0';
  pcVar26[0x3a] = -0x80;
  pcVar26[0x3b] = -1;
  pcVar26[0x3c] = '\0';
  pcVar26[0x3d] = '\0';
  pcVar26[0x3e] = -0x80;
  pcVar26[0x3f] = -1;
  pcVar26[0] = '\b';
  pcVar26[1] = '\0';
  pcVar26[2] = '\0';
  pcVar26[3] = '\0';
  pcVar26[4] = '\0';
  pcVar26[5] = '\0';
  pcVar26[6] = '\0';
  pcVar26[7] = '\0';
  pcVar26[8] = '\b';
  pcVar26[9] = '\0';
  pcVar26[10] = '\0';
  pcVar26[0xb] = '\0';
  pcVar26[0xc] = '\0';
  pcVar26[0xd] = '\0';
  pcVar26[0xe] = '\0';
  pcVar26[0xf] = '\0';
  pcVar26[0x10] = '\b';
  pcVar26[0x11] = '\0';
  pcVar26[0x12] = '\0';
  pcVar26[0x13] = '\0';
  pcVar26[0x14] = '\0';
  pcVar26[0x15] = '\0';
  pcVar26[0x16] = '\0';
  pcVar26[0x17] = '\0';
  pcVar26[0x18] = '\b';
  pcVar26[0x19] = '\0';
  pcVar26[0x1a] = '\0';
  pcVar26[0x1b] = '\0';
  pcVar26[0x1c] = '\0';
  pcVar26[0x1d] = '\0';
  pcVar26[0x1e] = '\0';
  pcVar26[0x1f] = '\0';
  if ((this->super_Settings).singleThreadThreshold < (ulong)(current->_end - current->_begin)) {
    local_1e0.bounds = (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])local_1b8;
    local_1e0.depth = &local_2f8;
    local_1e0.children = (range<unsigned_int> (*) [8])&local_2b8;
    local_278[0xc] = proxy_support;
    local_278[0xd] = (context_traits)0x4;
    local_258[0] = (anon_union_16_2_47237d3f_for_Vec3fx_0)(ZEXT816(0) << 0x20);
    local_238 = CUSTOM_CTX;
    local_1e0.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize((task_group_context *)local_278);
    local_2d0.my_begin = 0;
    local_2d0.my_grainsize = 1;
    local_2d0.my_end = (unsigned_long)pMVar27;
    local_1c0.func = &local_1e0;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_2d0,&local_1c0,&local_2f9,(task_group_context *)local_278);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_278);
    if (cVar9 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_278);
  }
  else {
    if (pMVar27 == (MutexSys *)0x0) {
      local_2e8._8_4_ = 0x7f800000;
      local_2e8._0_8_ = 0x7f8000007f800000;
      local_2e8._12_4_ = 0x7f800000;
      local_1f8._8_4_ = 0xff800000;
      local_1f8._0_8_ = 0xff800000ff800000;
      local_1f8._12_4_ = 0xff800000;
      goto LAB_0154fed5;
    }
    prVar25 = &local_2b8;
    psVar21 = (size_t *)&local_1b8[0].field_0x20;
    pMVar18 = pMVar27;
    do {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      recurse((BVHNodeRecord<embree::NodeRefPtr<4>_> *)local_278,this,local_2f8 + 1,prVar25,alloc_00
              ,false);
      (((ThreadLocal2 *)(psVar21 + -4))->mutex).mutex = (void *)local_278._0_8_;
      *(undefined8 *)(psVar21 + -2) = local_278._16_8_;
      psVar21[-1] = local_278._24_8_;
      *psVar21 = local_258[0]._0_8_;
      psVar21[1] = local_258[0]._8_8_;
      psVar21 = psVar21 + 6;
      prVar25 = prVar25 + 1;
      pMVar18 = (MutexSys *)((long)&pMVar18[-1].mutex + 7);
    } while (pMVar18 != (MutexSys *)0x0);
  }
  local_2e8._8_4_ = 0x7f800000;
  local_2e8._0_8_ = 0x7f8000007f800000;
  local_2e8._12_4_ = 0x7f800000;
  local_1f8._8_4_ = 0xff800000;
  local_1f8._0_8_ = 0xff800000ff800000;
  local_1f8._12_4_ = 0xff800000;
  if (pMVar27 != (MutexSys *)0x0) {
    local_2e8._8_4_ = 0x7f800000;
    local_2e8._0_8_ = 0x7f8000007f800000;
    local_2e8._12_4_ = 0x7f800000;
    local_1f8._8_4_ = 0xff800000;
    local_1f8._0_8_ = 0xff800000ff800000;
    local_1f8._12_4_ = 0xff800000;
    pauVar12 = (undefined1 (*) [16])&local_1b8[0].field_0x20;
    pMVar18 = (MutexSys *)0x0;
    do {
      auVar28 = pauVar12[-1];
      auVar3 = *pauVar12;
      *(undefined8 *)(pcVar26 + (long)pMVar18 * 8) = *(undefined8 *)pauVar12[-2];
      *(int *)(pcVar26 + (long)pMVar18 * 4 + 0x20) = auVar28._0_4_;
      uVar4 = vextractps_avx(auVar28,1);
      *(undefined4 *)(pcVar26 + (long)pMVar18 * 4 + 0x40) = uVar4;
      uVar4 = vextractps_avx(auVar28,2);
      *(undefined4 *)(pcVar26 + (long)pMVar18 * 4 + 0x60) = uVar4;
      *(int *)(pcVar26 + (long)pMVar18 * 4 + 0x30) = auVar3._0_4_;
      uVar4 = vextractps_avx(auVar3,1);
      *(undefined4 *)(pcVar26 + (long)pMVar18 * 4 + 0x50) = uVar4;
      local_2e8 = vminps_avx(local_2e8,auVar28);
      uVar4 = vextractps_avx(auVar3,2);
      *(undefined4 *)(pcVar26 + (long)pMVar18 * 4 + 0x70) = uVar4;
      local_1f8 = vmaxps_avx(local_1f8,auVar3);
      pMVar18 = (MutexSys *)((long)&pMVar18->mutex + 1);
      pauVar12 = pauVar12 + 3;
    } while (pMVar27 != pMVar18);
  }
LAB_0154fed5:
  if (pMVar27 == (MutexSys *)0x0) {
    uVar17 = 0;
  }
  else {
    piVar13 = (int *)&local_1b8[0].field_0x1c;
    uVar17 = 0;
    pMVar18 = pMVar27;
    do {
      uVar17 = uVar17 + (long)*piVar13;
      piVar13 = piVar13 + 0xc;
      pMVar18 = (MutexSys *)((long)&pMVar18[-1].mutex + 7);
    } while (pMVar18 != (MutexSys *)0x0);
  }
  if ((0xfff < uVar17) && (pMVar27 != (MutexSys *)0x0)) {
    piVar13 = (int *)&local_1b8[0].field_0x1c;
    pMVar18 = (MutexSys *)0x0;
    do {
      if (*piVar13 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar26 + (long)pMVar18 * 8),1);
        pcVar26[(long)pMVar18 * 8 + 7] = pcVar26[(long)pMVar18 * 8 + 7] | 0x80;
      }
      pMVar18 = (MutexSys *)((long)&pMVar18->mutex + 1);
      piVar13 = piVar13 + 0xc;
    } while (pMVar27 != pMVar18);
  }
  aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_2e8,ZEXT416((uint)uVar17),0x30)
  ;
  (local_2f0->ref).ptr = (size_t)pcVar26;
  (local_2f0->bounds).lower.field_0 = aVar6;
  *(undefined8 *)&(local_2f0->bounds).upper.field_0 = local_1f8._0_8_;
  *(undefined8 *)((long)&(local_2f0->bounds).upper.field_0 + 8) = local_1f8._8_8_;
  return local_2f0;
}

Assistant:

ReductionTy recurse(size_t depth, const range<unsigned>& current, Allocator alloc, bool toplevel)
        {
          /* get thread local allocator */
          if (!alloc)
            alloc = createAllocator();

          /* call memory monitor function to signal progress */
          if (toplevel && current.size() <= singleThreadThreshold)
            progressMonitor(current.size());

          /* create leaf node */
          if (unlikely(depth+MIN_LARGE_LEAF_LEVELS >= maxDepth || current.size() <= minLeafSize))
            return createLargeLeaf(depth,current,alloc);

          /* fill all children by always splitting the one with the largest surface area */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          split(current,children[0],children[1]);
          size_t numChildren = 2;

          while (numChildren < branchingFactor)
          {
            /* find best child with largest number of primitives */
            int bestChild = -1;
            unsigned bestItems = 0;
            for (unsigned int i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= minLeafSize)
                continue;

              /* remember child with largest area */
              if (children[i].size() > bestItems) {
                bestItems = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == -1) break;

            /*! split best child into left and right child */
            range<unsigned> left, right;
            split(children[bestChild],left,right);

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = left;
            children[numChildren+0] = right;
            numChildren++;
          }

          /* create leaf node if no split is possible */
          if (unlikely(numChildren == 1))
            return createLeaf(current,alloc);

          /* allocate node */
          auto node = createNode(alloc,numChildren);

          /* process top parts of tree parallel */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          if (current.size() > singleThreadThreshold)
          {
            /*! parallel_for is faster than spawning sub-tasks */
            parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  bounds[i] = recurse(depth+1,children[i],nullptr,true);
                  _mm_mfence(); // to allow non-temporal stores during build
                }
              });
          }

          /* finish tree sequentially */
          else
          {
            for (size_t i=0; i<numChildren; i++)
              bounds[i] = recurse(depth+1,children[i],alloc,false);
          }

          return setBounds(node,bounds,numChildren);
        }